

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void count(void)

{
  Configuration *pCVar1;
  int iVar2;
  allocator local_1f2;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  LLogMessage local_1b0;
  
  for (iVar2 = 0; iVar2 != 99; iVar2 = iVar2 + 1) {
    pCVar1 = ins::Configuration::GetInstance();
    if ((int)pCVar1->log_level_ < 2) {
      std::__cxx11::string::string
                ((string *)&local_1d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jerett[P]llog/main.cpp",
                 &local_1f1);
      std::__cxx11::string::string((string *)&local_1f0,"count",&local_1f2);
      ins::LLogMessage::LLogMessage(&local_1b0,&local_1d0,&local_1f0,0x13,1);
      std::ostream::operator<<((ostream *)&local_1b0,iVar2);
      ins::LLogMessage::~LLogMessage(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
  }
  return;
}

Assistant:

void count() {
  for (int i = 0 ; i < 99; ++i) {
    LOG(INFO) << i;
//    CHECK(i < 90) << " meet 90 first i:" << i;
  }
}